

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O0

void __thiscall
chrono::ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed>::CreateJacobianMatrices
          (ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this)

{
  undefined8 uVar1;
  ChLoadJacobians *this_00;
  element_type *peVar2;
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> local_60;
  undefined1 local_48 [24];
  vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> mvars;
  ChLoad<chrono::fea::ChLoaderBeamWrenchDistributed> *this_local;
  
  if (*(long *)&this->field_0x38 == 0) {
    this_00 = (ChLoadJacobians *)operator_new(0x80);
    ChLoadJacobians::ChLoadJacobians(this_00);
    *(ChLoadJacobians **)&this->field_0x38 = this_00;
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
              ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
               (local_48 + 0x10));
    ChLoaderU::GetLoadable((ChLoaderU *)local_48);
    peVar2 = std::__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    (**(code **)(*(long *)peVar2 + 0x60))
              (peVar2,(vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
                      (local_48 + 0x10));
    std::shared_ptr<chrono::ChLoadable>::~shared_ptr((shared_ptr<chrono::ChLoadable> *)local_48);
    uVar1 = *(undefined8 *)&this->field_0x38;
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::vector
              (&local_60,
               (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
               (local_48 + 0x10));
    chrono::ChLoadJacobians::SetVariables(uVar1,&local_60);
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~vector(&local_60);
    std::vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>::~vector
              ((vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_> *)
               (local_48 + 0x10));
  }
  return;
}

Assistant:

inline void ChLoad<Tloader>::CreateJacobianMatrices() {
    if (!this->jacobians) {
        // create jacobian structure
        this->jacobians = new ChLoadJacobians;
        // set variables forsparse KRM block
        std::vector<ChVariables*> mvars;
        loader.GetLoadable()->LoadableGetVariables(mvars);
        this->jacobians->SetVariables(mvars);
    }
}